

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_sampler_expression_abi_cxx11_(CompilerHLSL *this,uint32_t id)

{
  char *pcVar1;
  string *psVar2;
  bool in_DL;
  size_type index;
  undefined1 local_60 [40];
  string expr;
  uint32_t id_local;
  CompilerHLSL *this_local;
  
  CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_60,id,in_DL);
  join<char_const(&)[2],std::__cxx11::string>
            ((spirv_cross *)(local_60 + 0x20),(char (*) [2])0x4e3b4c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  ::std::__cxx11::string::~string((string *)local_60);
  pcVar1 = (char *)::std::__cxx11::string::find_first_of((char)local_60 + ' ',0x5b);
  if (pcVar1 == (char *)0xffffffffffffffff) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_60 + 0x20);
  }
  else {
    psVar2 = (string *)::std::__cxx11::string::insert((ulong)(local_60 + 0x20),pcVar1);
    ::std::__cxx11::string::string((string *)this,psVar2);
  }
  ::std::__cxx11::string::~string((string *)(local_60 + 0x20));
  return this;
}

Assistant:

string CompilerHLSL::to_sampler_expression(uint32_t id)
{
	auto expr = join("_", to_expression(id));
	auto index = expr.find_first_of('[');
	if (index == string::npos)
	{
		return expr + "_sampler";
	}
	else
	{
		// We have an expression like _ident[array], so we cannot tack on _sampler, insert it inside the string instead.
		return expr.insert(index, "_sampler");
	}
}